

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_stroke_circle(nk_command_buffer *b,nk_rect r,float line_thickness,nk_color c)

{
  float fVar1;
  void *pvVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = r.w;
  fVar6 = r.h;
  fVar3 = r.x;
  fVar4 = r.y;
  if ((((0.0 < line_thickness) && (b != (nk_command_buffer *)0x0)) &&
      ((fVar5 != 0.0 || (NAN(fVar5))))) &&
     ((((fVar6 != 0.0 || (NAN(fVar6))) &&
       ((b->use_clipping == 0 ||
        ((((fVar1 = (b->clip).x, fVar1 <= fVar5 + fVar3 && (fVar3 <= fVar1 + (b->clip).w)) &&
          (fVar1 = (b->clip).y, fVar1 <= fVar4 + fVar6)) && (fVar4 <= fVar1 + (b->clip).h)))))) &&
      (pvVar2 = nk_command_buffer_push(b,NK_COMMAND_CIRCLE,0x20), pvVar2 != (void *)0x0)))) {
    *(short *)((long)pvVar2 + 0x14) = (short)(int)line_thickness;
    *(short *)((long)pvVar2 + 0x10) = (short)(int)fVar3;
    *(short *)((long)pvVar2 + 0x12) = (short)(int)fVar4;
    fVar3 = 0.0;
    if (0.0 <= fVar5) {
      fVar3 = fVar5;
    }
    *(short *)((long)pvVar2 + 0x16) = (short)(int)fVar3;
    fVar3 = 0.0;
    if (0.0 <= fVar6) {
      fVar3 = fVar6;
    }
    *(short *)((long)pvVar2 + 0x18) = (short)(int)fVar3;
    *(nk_color *)((long)pvVar2 + 0x1a) = c;
  }
  return;
}

Assistant:

NK_API void
nk_stroke_circle(struct nk_command_buffer *b, struct nk_rect r,
    float line_thickness, struct nk_color c)
{
    struct nk_command_circle *cmd;
    if (!b || r.w == 0 || r.h == 0 || line_thickness <= 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(r.x, r.y, r.w, r.h, clip->x, clip->y, clip->w, clip->h))
            return;
    }

    cmd = (struct nk_command_circle*)
        nk_command_buffer_push(b, NK_COMMAND_CIRCLE, sizeof(*cmd));
    if (!cmd) return;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(r.w, 0);
    cmd->h = (unsigned short)NK_MAX(r.h, 0);
    cmd->color = c;
}